

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void prvTidyWbrToSpace(TidyDocImpl *doc,Node *node)

{
  Node **ppNVar1;
  Node *pNVar2;
  Node *node_00;
  
  while (node != (Node *)0x0) {
    pNVar2 = node->next;
    if ((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_WBR)) {
      ppNVar1 = &node->content;
      node = pNVar2;
      if (*ppNVar1 != (Node *)0x0) {
        prvTidyWbrToSpace(doc,*ppNVar1);
      }
    }
    else {
      node_00 = prvTidyNewLiteralTextNode(doc->lexer," ");
      prvTidyInsertNodeAfterElement(node,node_00);
      prvTidyRemoveNode(node);
      prvTidyFreeNode(doc,node);
      node = pNVar2;
    }
  }
  return;
}

Assistant:

void TY_(WbrToSpace)(TidyDocImpl* doc, Node* node)
{
    Node* next;

    while (node)
    {
        next = node->next;

        if (nodeIsWBR(node))
        {
            Node* text;
            text = TY_(NewLiteralTextNode)(doc->lexer, " ");
            TY_(InsertNodeAfterElement)(node, text);
            TY_(RemoveNode)(node);
            TY_(FreeNode)(doc, node);
            node = next;
            continue;
        }

        if (node->content)
            TY_(WbrToSpace)(doc, node->content);

        node = next;
   }
}